

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

void __thiscall directory::print(directory *this)

{
  uint uVar1;
  uint *puVar2;
  pointer piVar3;
  uint *puVar4;
  ostream *poVar5;
  long *plVar6;
  ulong in_RCX;
  bool bVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  vector<int,_std::allocator<int>_> *__range2;
  index *index;
  pointer piVar8;
  ulong uVar9;
  vector<int,_std::allocator<int>_> visited;
  bucket bucket;
  fstream bucketFile;
  vector<int,_std::allocator<int>_> local_288;
  bucket local_270;
  string *local_248;
  uint local_240 [132];
  
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  if (this->bucket_size != 0) {
    local_248 = &this->typeName;
    uVar9 = 0;
    do {
      if (local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
LAB_0010de7d:
        local_240[0] = (this->bucket_ids).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9];
        if (local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_288,
                     (iterator)
                     local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_240);
        }
        else {
          *local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_240[0];
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        generateBucketFileName
                  ((string *)&local_270,local_248,
                   (this->bucket_ids).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9]);
        std::fstream::fstream(local_240,(string *)&local_270,_S_out|_S_in|_S_bin);
        __buf = extraout_RDX;
        if ((vector<index,_std::allocator<index>_> *)CONCAT44(local_270._4_4_,local_270.id) !=
            &local_270.indices) {
          operator_delete((undefined1 *)CONCAT44(local_270._4_4_,local_270.id),
                          (ulong)((long)&(local_270.indices.
                                          super__Vector_base<index,_std::allocator<index>_>._M_impl.
                                          super__Vector_impl_data._M_start)->file_id + 1));
          __buf = extraout_RDX_00;
        }
        local_270._4_4_ = local_270._4_4_ & 0xffffff00;
        local_270.depth = 1;
        local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::bucket::read(&local_270,(int)local_240,__buf,in_RCX);
        piVar3 = local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar8 = local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                      super__Vector_impl_data._M_start; piVar8 != piVar3; piVar8 = piVar8 + 1) {
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(uint)piVar8->page_id);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(uint)piVar8->record_id);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
          plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,piVar8->value);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
        }
        if (local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_270.indices.super__Vector_base<index,_std::allocator<index>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_270.indices.super__Vector_base<index,_std::allocator<index>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_270.indices.super__Vector_base<index,_std::allocator<index>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::fstream::~fstream(local_240);
      }
      else {
        uVar1 = (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9];
        in_RCX = (ulong)uVar1;
        puVar2 = (uint *)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        do {
          puVar4 = puVar2 + 1;
          bVar7 = false;
          if (*puVar2 == uVar1) {
            bVar7 = true;
            break;
          }
          puVar2 = puVar4;
        } while (puVar4 != (uint *)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish);
        if (!bVar7) goto LAB_0010de7d;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->bucket_size);
  }
  if ((uint *)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void directory::split(bucket &bucket, int bucket_no) {
    int local_depth, dir_depth = depth, pair_index;

    bucket.increaseDepth();

    local_depth = bucket.getDepth();

    class bucket split_bucket;

    split_bucket.id = generateBucketId(typeName);
    split_bucket.depth = local_depth;

    pair_index = pairIndex(bucket_no, local_depth);

    if(local_depth > depth) {
        grow();
        bucket_ids[bucket_no + (1 << dir_depth) ] = split_bucket.id;
    } else {
        if(bucket_no + (1 << (dir_depth - 1)) >= bucket_size) {

            bucket_ids[bucket_no ] = split_bucket.id;
        } else {

            bucket_ids[bucket_no + (1 << (dir_depth - 1)) ] = split_bucket.id;
        }
    }


    vector<index> copy = vector<index>(bucket.indices.begin(), bucket.indices.end());

    bucket.clear();

    for(auto &i: copy) {
        int _bucket_no = hash(i.value);

        if(bucket_ids[_bucket_no ] == split_bucket.id) {
            split_bucket.insert(i);
        } else if(bucket_ids[_bucket_no ] == bucket.id){
            bucket.insert(i);
        } else {
            cout << "error";
        }
    }

    fstream splitBucketFile(generateBucketFileName(typeName, split_bucket.id), OUTBIN);

    split_bucket.write(splitBucketFile);
}